

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall InterpTest_Disassemble_Test::TestBody(InterpTest_Disassemble_Test *this)

{
  pointer *__ptr;
  OutputBuffer *local_48;
  undefined1 local_40 [32];
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> local_20;
  
  InterpTest::ReadModule
            (&this->super_InterpTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             (anonymous_namespace)::s_fac_module);
  wabt::MemoryStream::MemoryStream((MemoryStream *)local_40,(Stream *)0x0);
  wabt::interp::Istream::Disassemble
            (&(this->super_InterpTest).module_desc_.istream,(Stream *)local_40);
  wabt::MemoryStream::ReleaseOutputBuffer((MemoryStream *)local_40);
  InterpTest::ExpectBufferStrEq
            (&this->super_InterpTest,local_48,
             "   0| alloca 1\n   8| i32.const 1\n  16| local.set $2, %[-1]\n  24| local.get $1\n  32| local.get $3\n  40| i32.eqz %[-1]\n  44| br_unless @60, %[-1]\n  52| br @116\n  60| local.get $3\n  68| i32.mul %[-2], %[-1]\n  72| local.set $2, %[-1]\n  80| local.get $2\n  88| i32.const 1\n  96| i32.sub %[-2], %[-1]\n 100| local.set $3, %[-1]\n 108| br @24\n 116| drop_keep $2 $1\n 128| return\n"
            );
  if (local_48 != (OutputBuffer *)0x0) {
    std::default_delete<wabt::OutputBuffer>::operator()
              ((default_delete<wabt::OutputBuffer> *)&local_48,local_48);
  }
  local_40._0_8_ = &PTR__MemoryStream_002430f8;
  if ((tuple<wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>)
      local_20._M_t.
      super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
      super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
      super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wabt::OutputBuffer_*,_false>)0x0) {
    std::default_delete<wabt::OutputBuffer>::operator()
              ((default_delete<wabt::OutputBuffer> *)&local_20,
               (OutputBuffer *)
               local_20._M_t.
               super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
               .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

TEST_F(InterpTest, Disassemble) {
  ReadModule(s_fac_module);

  MemoryStream stream;
  module_desc_.istream.Disassemble(&stream);
  auto buf = stream.ReleaseOutputBuffer();

  ExpectBufferStrEq(*buf,
R"(   0| alloca 1
   8| i32.const 1
  16| local.set $2, %[-1]
  24| local.get $1
  32| local.get $3
  40| i32.eqz %[-1]
  44| br_unless @60, %[-1]
  52| br @116
  60| local.get $3
  68| i32.mul %[-2], %[-1]
  72| local.set $2, %[-1]
  80| local.get $2
  88| i32.const 1
  96| i32.sub %[-2], %[-1]
 100| local.set $3, %[-1]
 108| br @24
 116| drop_keep $2 $1
 128| return
)");
}